

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ConcatenationExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ConcatenationExpression,slang::ast::Type_const&,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange>
          (BumpAllocator *this,Type *args,
          span<const_slang::ast::Expression_*,_18446744073709551615UL> *args_1,SourceRange *args_2)

{
  pointer ppEVar1;
  size_t sVar2;
  SourceLocation SVar3;
  SourceLocation SVar4;
  ConcatenationExpression *pCVar5;
  
  pCVar5 = (ConcatenationExpression *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ConcatenationExpression *)this->endPtr < pCVar5 + 1) {
    pCVar5 = (ConcatenationExpression *)allocateSlow(this,0x40,8);
  }
  else {
    this->head->current = (byte *)(pCVar5 + 1);
  }
  ppEVar1 = args_1->_M_ptr;
  sVar2 = (args_1->_M_extent)._M_extent_value;
  SVar3 = args_2->startLoc;
  SVar4 = args_2->endLoc;
  (pCVar5->super_Expression).kind = Concatenation;
  (pCVar5->super_Expression).type.ptr = args;
  (pCVar5->super_Expression).constant = (ConstantValue *)0x0;
  (pCVar5->super_Expression).syntax = (ExpressionSyntax *)0x0;
  (pCVar5->super_Expression).sourceRange.startLoc = SVar3;
  (pCVar5->super_Expression).sourceRange.endLoc = SVar4;
  (pCVar5->operands_)._M_ptr = ppEVar1;
  (pCVar5->operands_)._M_extent._M_extent_value = sVar2;
  return pCVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }